

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Emu.cpp
# Opt level: O2

void __thiscall Sap_Emu::cpu_jsr(Sap_Emu *this,sap_addr_t addr)

{
  byte bVar1;
  byte bVar2;
  
  (this->super_Sap_Cpu).r.pc = (uint16_t)addr;
  bVar1 = (this->super_Sap_Cpu).r.sp;
  bVar2 = 0xff;
  if ((this->mem).ram[0x1ff] != 0xfe || bVar1 != 0xfe) {
    bVar2 = bVar1;
  }
  (this->mem).ram[(ulong)bVar2 + 0x100] = 0xfe;
  (this->mem).ram[(ulong)(byte)(bVar2 - 1) + 0x100] = 0xfe;
  (this->super_Sap_Cpu).r.sp = bVar2 - 3;
  (this->mem).ram[(ulong)(bVar2 + 0xfe & 0xff) + 0x100] = 0xfe;
  return;
}

Assistant:

void Sap_Emu::cpu_jsr( sap_addr_t addr )
{
	check( r.sp >= 0xFE ); // catch anything trying to leave data on stack
	r.pc = addr;
	int high_byte = (idle_addr - 1) >> 8;
	if ( r.sp == 0xFE && mem.ram [0x1FF] == high_byte )
		r.sp = 0xFF; // pop extra byte off
	mem.ram [0x100 + r.sp--] = high_byte; // some routines use RTI to return
	mem.ram [0x100 + r.sp--] = high_byte;
	mem.ram [0x100 + r.sp--] = (idle_addr - 1) & 0xFF;
}